

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

qint64 __thiscall
QNativeSocketEnginePrivate::nativeReceiveDatagram
          (QNativeSocketEnginePrivate *this,char *data,qint64 maxSize,QIpPacketHeader *header,
          PacketHeaderOptions options)

{
  Int IVar1;
  int *piVar2;
  long in_RCX;
  size_t in_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  bool bVar3;
  in_pktinfo *info_1;
  in6_pktinfo *info;
  cmsghdr *cmsgptr;
  ssize_t recvResult;
  char c;
  iovec vec;
  msghdr msg;
  qt_sockaddr aa;
  quintptr cbuf [8];
  undefined4 in_stack_fffffffffffffe88;
  PacketHeaderOption in_stack_fffffffffffffe8c;
  QIpPacketHeader *in_stack_fffffffffffffe90;
  QString *in_stack_fffffffffffffe98;
  SocketError error;
  qt_sockaddr *in_stack_fffffffffffffea0;
  cmsghdr *local_150;
  size_t local_140;
  undefined1 *local_138;
  cmsghdr *local_118;
  ssize_t local_110;
  undefined1 local_e0 [28];
  undefined4 local_c4;
  QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4> local_c0;
  QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4> local_bc;
  QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4> local_b8;
  undefined1 local_b1;
  iovec local_b0;
  msghdr local_a0;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  undefined4 local_4c;
  cmsghdr local_48 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = in_R8D;
  memset(local_48,0xaa,0x40);
  memset(&local_a0,0xaa,0x38);
  local_b0.iov_base = (void *)0xaaaaaaaaaaaaaaaa;
  local_b0.iov_len = 0xaaaaaaaaaaaaaaaa;
  local_64 = 0xaaaaaaaaaaaaaaaa;
  local_5c = 0xaaaaaaaaaaaaaaaa;
  local_54 = 0xaaaaaaaaaaaaaaaa;
  local_4c = 0xaaaaaaaa;
  local_b1 = 0xaa;
  memset(&local_a0,0,0x38);
  memset(&local_64,0,0x1c);
  local_138 = in_RSI;
  if (in_RDX == 0) {
    local_138 = &local_b1;
  }
  local_b0.iov_base = local_138;
  local_140 = in_RDX;
  if (in_RDX == 0) {
    local_140 = 1;
  }
  local_b0.iov_len = local_140;
  local_a0.msg_iov = &local_b0;
  local_a0.msg_iovlen = 1;
  local_b8.super_QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>.i =
       (QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>)
       QFlags<QAbstractSocketEngine::PacketHeaderOption>::operator&
                 ((QFlags<QAbstractSocketEngine::PacketHeaderOption> *)in_stack_fffffffffffffe90,
                  in_stack_fffffffffffffe8c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_b8);
  if (IVar1 != 0) {
    local_a0.msg_name = &local_64;
    local_a0.msg_namelen = 0x1c;
  }
  local_c0.super_QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>.i =
       (QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>)
       ::operator|((enum_type)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                   (enum_type)in_stack_fffffffffffffe90);
  QFlags<QAbstractSocketEngine::PacketHeaderOption>::operator|
            ((QFlags<QAbstractSocketEngine::PacketHeaderOption> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe8c);
  local_bc.super_QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>.i =
       (QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>)
       QFlags<QAbstractSocketEngine::PacketHeaderOption>::operator&
                 ((QFlags<QAbstractSocketEngine::PacketHeaderOption> *)in_stack_fffffffffffffe90,
                  (QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4>)
                  SUB84(in_stack_fffffffffffffe98,0));
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bc);
  if (IVar1 != 0) {
    local_a0.msg_control = local_48;
    local_a0.msg_controllen = 0x40;
  }
  do {
    local_110 = recvmsg((int)*(undefined8 *)(in_RDI + 0xd8),&local_a0,0);
    bVar3 = false;
    if (local_110 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (local_110 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      local_110 = -2;
    }
    else {
      error = (SocketError)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      if (*piVar2 == 0x6f) {
        setError((QNativeSocketEnginePrivate *)&in_stack_fffffffffffffea0->a,error,
                 (ErrorString)in_stack_fffffffffffffe98);
      }
      else {
        setError((QNativeSocketEnginePrivate *)&in_stack_fffffffffffffea0->a,error,
                 (ErrorString)in_stack_fffffffffffffe98);
      }
    }
    if (in_RCX != 0) {
      QIpPacketHeader::clear(in_stack_fffffffffffffe90);
    }
  }
  else {
    local_c4 = local_68;
    bVar3 = ::operator!=((QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4>)
                         SUB84((ulong)in_stack_fffffffffffffe98 >> 0x20,0),
                         (PacketHeaderOption)in_stack_fffffffffffffe90);
    if (bVar3) {
      qt_socket_getPortAndAddress
                (in_stack_fffffffffffffea0,(quint16 *)in_stack_fffffffffffffe98,
                 &in_stack_fffffffffffffe90->senderAddress);
      *(undefined2 *)(in_RCX + 0x1e) = *(undefined2 *)(in_RDI + 0xb0);
      *(bool *)(in_RCX + 0x20) = (local_a0.msg_flags & 0x80U) != 0;
      if (local_a0.msg_controllen < 0x10) {
        local_150 = (cmsghdr *)0x0;
      }
      else {
        local_150 = (cmsghdr *)local_a0.msg_control;
      }
      for (local_118 = local_150; local_118 != (cmsghdr *)0x0;
          local_118 = __cmsg_nxthdr(&local_a0,local_118)) {
        if (((local_118->cmsg_level == 0x29) && (local_118->cmsg_type == 0x32)) &&
           (0x23 < local_118->cmsg_len)) {
          QHostAddress::setAddress
                    (&in_stack_fffffffffffffe90->senderAddress,
                     (quint8 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          *(int *)(in_RCX + 0x10) = (int)local_118[2].cmsg_len;
          if (*(int *)(in_RCX + 0x10) != 0) {
            QString::number((uint)local_e0,(int)local_118[2].cmsg_len);
            QHostAddress::setScopeId
                      ((QHostAddress *)&in_stack_fffffffffffffea0->a,in_stack_fffffffffffffe98);
            QString::~QString((QString *)0x35bd39);
          }
        }
        if (((local_118->cmsg_level == 0) && (local_118->cmsg_type == 8)) &&
           (0x1b < local_118->cmsg_len)) {
          in_stack_fffffffffffffea0 = (qt_sockaddr *)(in_RCX + 8);
          ntohl(local_118[1].cmsg_level);
          QHostAddress::setAddress
                    (&in_stack_fffffffffffffe90->senderAddress,in_stack_fffffffffffffe8c);
          *(int *)(in_RCX + 0x10) = (int)local_118[1].cmsg_len;
        }
        if ((local_118->cmsg_len == 0x14) &&
           (((local_118->cmsg_level == 0x29 && (local_118->cmsg_type == 0x34)) ||
            ((local_118->cmsg_level == 0 && (local_118->cmsg_type == 2)))))) {
          *(int *)(in_RCX + 0x14) = (int)local_118[1].cmsg_len;
        }
      }
    }
  }
  if ((in_RDX == 0) && (-1 < local_110)) {
    local_110 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_110;
}

Assistant:

qint64 QNativeSocketEnginePrivate::nativeReceiveDatagram(char *data, qint64 maxSize, QIpPacketHeader *header,
                                                         QAbstractSocketEngine::PacketHeaderOptions options)
{
    // we use quintptr to force the alignment
    quintptr cbuf[(CMSG_SPACE(sizeof(struct in6_pktinfo)) + CMSG_SPACE(sizeof(int))
#if !defined(IP_PKTINFO) && defined(IP_RECVIF) && defined(Q_OS_BSD4)
                   + CMSG_SPACE(sizeof(sockaddr_dl))
#endif
#ifndef QT_NO_SCTP
                   + CMSG_SPACE(sizeof(struct sctp_sndrcvinfo))
#endif
                   + sizeof(quintptr) - 1) / sizeof(quintptr)];

    struct msghdr msg;
    struct iovec vec;
    qt_sockaddr aa;
    char c;
    memset(&msg, 0, sizeof(msg));
    memset(&aa, 0, sizeof(aa));

    // we need to receive at least one byte, even if our user isn't interested in it
    vec.iov_base = maxSize ? data : &c;
    vec.iov_len = maxSize ? maxSize : 1;
    msg.msg_iov = &vec;
    msg.msg_iovlen = 1;
    if (options & QAbstractSocketEngine::WantDatagramSender) {
        msg.msg_name = &aa;
        msg.msg_namelen = sizeof(aa);
    }
    if (options & (QAbstractSocketEngine::WantDatagramHopLimit | QAbstractSocketEngine::WantDatagramDestination
                   | QAbstractSocketEngine::WantStreamNumber)) {
        msg.msg_control = cbuf;
        msg.msg_controllen = sizeof(cbuf);
    }

    ssize_t recvResult = 0;
    do {
        recvResult = ::recvmsg(socketDescriptor, &msg, 0);
    } while (recvResult == -1 && errno == EINTR);

    if (recvResult == -1) {
        switch (errno) {
#if defined(EWOULDBLOCK) && EWOULDBLOCK != EAGAIN
        case EWOULDBLOCK:
#endif
        case EAGAIN:
            // No datagram was available for reading
            recvResult = -2;
            break;
        case ECONNREFUSED:
            setError(QAbstractSocket::ConnectionRefusedError, ConnectionRefusedErrorString);
            break;
        default:
            setError(QAbstractSocket::NetworkError, ReceiveDatagramErrorString);
        }
        if (header)
            header->clear();
    } else if (options != QAbstractSocketEngine::WantNone) {
        Q_ASSERT(header);
        qt_socket_getPortAndAddress(&aa, &header->senderPort, &header->senderAddress);
        header->destinationPort = localPort;
        header->endOfRecord = (msg.msg_flags & MSG_EOR) != 0;

        // parse the ancillary data
        struct cmsghdr *cmsgptr;
        QT_WARNING_PUSH
        QT_WARNING_DISABLE_CLANG("-Wsign-compare")
        for (cmsgptr = CMSG_FIRSTHDR(&msg); cmsgptr != nullptr;
             cmsgptr = CMSG_NXTHDR(&msg, cmsgptr)) {
            QT_WARNING_POP
            if (cmsgptr->cmsg_level == IPPROTO_IPV6 && cmsgptr->cmsg_type == IPV6_PKTINFO
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(in6_pktinfo))) {
                in6_pktinfo *info = reinterpret_cast<in6_pktinfo *>(CMSG_DATA(cmsgptr));

                header->destinationAddress.setAddress(reinterpret_cast<quint8 *>(&info->ipi6_addr));
                header->ifindex = info->ipi6_ifindex;
                if (header->ifindex)
                    header->destinationAddress.setScopeId(QString::number(info->ipi6_ifindex));
            }

#ifdef IP_PKTINFO
            if (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_PKTINFO
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(in_pktinfo))) {
                in_pktinfo *info = reinterpret_cast<in_pktinfo *>(CMSG_DATA(cmsgptr));

                header->destinationAddress.setAddress(ntohl(info->ipi_addr.s_addr));
                header->ifindex = info->ipi_ifindex;
            }
#else
#  ifdef IP_RECVDSTADDR
            if (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_RECVDSTADDR
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(in_addr))) {
                in_addr *addr = reinterpret_cast<in_addr *>(CMSG_DATA(cmsgptr));

                header->destinationAddress.setAddress(ntohl(addr->s_addr));
            }
#  endif
#  if defined(IP_RECVIF) && defined(Q_OS_BSD4)
            if (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_RECVIF
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(sockaddr_dl))) {
                sockaddr_dl *sdl = reinterpret_cast<sockaddr_dl *>(CMSG_DATA(cmsgptr));
                header->ifindex = sdl->sdl_index;
            }
#  endif
#endif

            if (cmsgptr->cmsg_len == CMSG_LEN(sizeof(int))
                    && ((cmsgptr->cmsg_level == IPPROTO_IPV6 && cmsgptr->cmsg_type == IPV6_HOPLIMIT)
                        || (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_TTL))) {
                static_assert(sizeof(header->hopLimit) == sizeof(int));
                memcpy(&header->hopLimit, CMSG_DATA(cmsgptr), sizeof(header->hopLimit));
            }

#ifndef QT_NO_SCTP
            if (cmsgptr->cmsg_level == IPPROTO_SCTP && cmsgptr->cmsg_type == SCTP_SNDRCV
                && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(sctp_sndrcvinfo))) {
                sctp_sndrcvinfo *rcvInfo = reinterpret_cast<sctp_sndrcvinfo *>(CMSG_DATA(cmsgptr));

                header->streamNumber = int(rcvInfo->sinfo_stream);
            }
#endif
        }
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeReceiveDatagram(%p \"%s\", %lli, %s, %i) == %lli",
           data, QtDebugUtils::toPrintable(data, recvResult, 16).constData(), maxSize,
           (recvResult != -1 && options != QAbstractSocketEngine::WantNone)
           ? header->senderAddress.toString().toLatin1().constData() : "(unknown)",
           (recvResult != -1 && options != QAbstractSocketEngine::WantNone)
           ? header->senderPort : 0, (qint64) recvResult);
#endif

    return qint64((maxSize || recvResult < 0) ? recvResult : Q_INT64_C(0));
}